

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_file_loop(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  uv_fs_t *__s1;
  char *pcVar5;
  char *pcVar6;
  uv_fs_t *puVar7;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_loop_t **unaff_R15;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_buf_t uVar8;
  uv_fs_t req;
  uv_loop_t *puStack_2a8;
  uint uStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  uv_fs_t *puStack_280;
  code *pcStack_278;
  code *pcStack_270;
  uv_loop_t *puStack_268;
  uint uStack_260;
  char *pcStack_258;
  undefined1 local_1c0 [88];
  long local_168;
  
  loop = (uv_loop_t *)uv_default_loop();
  unlink("test_symlink");
  puVar4 = (uv_loop_t *)0x0;
  iVar1 = uv_fs_symlink(0,local_1c0,"test_symlink","test_symlink",0,0);
  if (iVar1 == 0) {
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_open(0,local_1c0,"test_symlink",0,0,0);
    if (iVar1 != -0x28) goto LAB_00152a71;
    if (local_168 != -0x28) goto LAB_00152a76;
    uv_fs_req_cleanup(local_1c0);
    puVar4 = loop;
    iVar1 = uv_fs_open(loop,local_1c0,"test_symlink",0,0,open_loop_cb);
    if (iVar1 != 0) goto LAB_00152a7b;
    if (open_cb_count != 0) goto LAB_00152a80;
    puVar4 = loop;
    uv_run(loop,0);
    if (open_cb_count != 1) goto LAB_00152a85;
    unlink("test_symlink");
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    puVar4 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_file_loop_cold_1();
LAB_00152a71:
    run_test_fs_file_loop_cold_2();
LAB_00152a76:
    run_test_fs_file_loop_cold_3();
LAB_00152a7b:
    run_test_fs_file_loop_cold_4();
LAB_00152a80:
    run_test_fs_file_loop_cold_5();
LAB_00152a85:
    run_test_fs_file_loop_cold_6();
  }
  run_test_fs_file_loop_cold_7();
  if (puVar4->backend_fd == 1) {
    if (puVar4->watcher_queue[0] == (void *)0xffffffffffffffd8) {
      open_cb_count = open_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    open_loop_cb_cold_1();
  }
  open_loop_cb_cold_2();
  unlink("test_file");
  unlink("test_file2");
  puVar4 = (uv_loop_t *)uv_default_loop();
  loop = puVar4;
  iVar1 = uv_fs_open(puVar4,&open_req1,"test_file",0x41,0x180,create_cb);
  if (iVar1 == 0) {
    puVar4 = loop;
    uv_run(loop,0);
    if (create_cb_count != 1) goto LAB_00152d5f;
    if (write_cb_count != 1) goto LAB_00152d64;
    if (fsync_cb_count != 1) goto LAB_00152d69;
    if (fdatasync_cb_count != 1) goto LAB_00152d6e;
    if (close_cb_count != 1) goto LAB_00152d73;
    puVar4 = loop;
    iVar1 = uv_fs_rename(loop,&rename_req,"test_file","test_file2",rename_cb);
    if (iVar1 != 0) goto LAB_00152d78;
    puVar4 = loop;
    uv_run(loop,0);
    if (create_cb_count != 1) goto LAB_00152d7d;
    if (write_cb_count != 1) goto LAB_00152d82;
    if (close_cb_count != 1) goto LAB_00152d87;
    if (rename_cb_count != 1) goto LAB_00152d8c;
    puVar4 = loop;
    iVar1 = uv_fs_open(loop,&open_req1,"test_file2",2,0,open_cb);
    if (iVar1 != 0) goto LAB_00152d91;
    puVar4 = loop;
    uv_run(loop,0);
    if (open_cb_count != 1) goto LAB_00152d96;
    if (read_cb_count != 1) goto LAB_00152d9b;
    if (close_cb_count != 2) goto LAB_00152da0;
    if (rename_cb_count != 1) goto LAB_00152da5;
    if (create_cb_count != 1) goto LAB_00152daa;
    if (write_cb_count != 1) goto LAB_00152daf;
    if (ftruncate_cb_count != 1) goto LAB_00152db4;
    puVar4 = loop;
    iVar1 = uv_fs_open(loop,&open_req1,"test_file2",0,0,open_cb);
    if (iVar1 != 0) goto LAB_00152db9;
    puVar4 = loop;
    uv_run(loop,0);
    if (open_cb_count != 2) goto LAB_00152dbe;
    if (read_cb_count != 2) goto LAB_00152dc3;
    if (close_cb_count != 3) goto LAB_00152dc8;
    if (rename_cb_count != 1) goto LAB_00152dcd;
    if (unlink_cb_count != 1) goto LAB_00152dd2;
    if (create_cb_count != 1) goto LAB_00152dd7;
    if (write_cb_count != 1) goto LAB_00152ddc;
    if (ftruncate_cb_count != 1) goto LAB_00152de1;
    unlink("test_file");
    unlink("test_file2");
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    puVar4 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_file_async_cold_1();
LAB_00152d5f:
    run_test_fs_file_async_cold_2();
LAB_00152d64:
    run_test_fs_file_async_cold_3();
LAB_00152d69:
    run_test_fs_file_async_cold_4();
LAB_00152d6e:
    run_test_fs_file_async_cold_5();
LAB_00152d73:
    run_test_fs_file_async_cold_6();
LAB_00152d78:
    run_test_fs_file_async_cold_7();
LAB_00152d7d:
    run_test_fs_file_async_cold_8();
LAB_00152d82:
    run_test_fs_file_async_cold_9();
LAB_00152d87:
    run_test_fs_file_async_cold_10();
LAB_00152d8c:
    run_test_fs_file_async_cold_11();
LAB_00152d91:
    run_test_fs_file_async_cold_12();
LAB_00152d96:
    run_test_fs_file_async_cold_13();
LAB_00152d9b:
    run_test_fs_file_async_cold_14();
LAB_00152da0:
    run_test_fs_file_async_cold_15();
LAB_00152da5:
    run_test_fs_file_async_cold_16();
LAB_00152daa:
    run_test_fs_file_async_cold_17();
LAB_00152daf:
    run_test_fs_file_async_cold_18();
LAB_00152db4:
    run_test_fs_file_async_cold_19();
LAB_00152db9:
    run_test_fs_file_async_cold_20();
LAB_00152dbe:
    run_test_fs_file_async_cold_21();
LAB_00152dc3:
    run_test_fs_file_async_cold_22();
LAB_00152dc8:
    run_test_fs_file_async_cold_23();
LAB_00152dcd:
    run_test_fs_file_async_cold_24();
LAB_00152dd2:
    run_test_fs_file_async_cold_25();
LAB_00152dd7:
    run_test_fs_file_async_cold_26();
LAB_00152ddc:
    run_test_fs_file_async_cold_27();
LAB_00152de1:
    run_test_fs_file_async_cold_28();
  }
  run_test_fs_file_async_cold_29();
  if (puVar4 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_00152e83;
    if (open_req1.result._4_4_ < 0) goto LAB_00152e88;
    create_cb_count = create_cb_count + 1;
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    puVar4 = loop;
    iVar1 = uv_fs_write(loop,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 == 0) {
      return 0x15a008;
    }
  }
  else {
    create_cb_cold_1();
LAB_00152e83:
    create_cb_cold_2();
LAB_00152e88:
    create_cb_cold_3();
  }
  create_cb_cold_4();
  if (puVar4 == (uv_loop_t *)&rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_00152eca;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(&rename_req);
      return iVar1;
    }
  }
  else {
    rename_cb_cold_1();
LAB_00152eca:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (puVar4 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_00152fbb;
    iVar1 = (int)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_00152fc0;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_00152fc5;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_00152fca;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    puVar4 = loop;
    iov = uVar8;
    iVar2 = uv_fs_read(loop,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    iVar1 = (int)puVar4;
    if (iVar2 == 0) {
      return 0x15a1c2;
    }
  }
  else {
    open_cb_cold_1();
LAB_00152fbb:
    iVar1 = (int)puVar4;
    open_cb_cold_2();
LAB_00152fc0:
    open_cb_cold_6();
LAB_00152fc5:
    open_cb_cold_5();
LAB_00152fca:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(iVar1);
  fs_file_sync(iVar1);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar4 = (uv_loop_t *)uv_default_loop();
  loop = puVar4;
  iVar1 = uv_fs_open(puVar4,&open_req1,"test_file",0x41,0x180,0);
  iVar2 = (int)puVar4;
  if (iVar1 < 0) {
    fs_file_sync_cold_1();
LAB_00153423:
    fs_file_sync_cold_2();
LAB_00153428:
    fs_file_sync_cold_3();
LAB_0015342d:
    fs_file_sync_cold_4();
LAB_00153432:
    fs_file_sync_cold_5();
LAB_00153437:
    fs_file_sync_cold_6();
LAB_0015343c:
    fs_file_sync_cold_7();
LAB_00153441:
    fs_file_sync_cold_8();
LAB_00153446:
    fs_file_sync_cold_9();
LAB_0015344b:
    fs_file_sync_cold_10();
LAB_00153450:
    fs_file_sync_cold_11();
LAB_00153455:
    fs_file_sync_cold_12();
LAB_0015345a:
    fs_file_sync_cold_13();
LAB_0015345f:
    fs_file_sync_cold_14();
LAB_00153464:
    fs_file_sync_cold_15();
LAB_00153469:
    fs_file_sync_cold_16();
LAB_0015346e:
    fs_file_sync_cold_17();
LAB_00153473:
    fs_file_sync_cold_18();
LAB_00153478:
    fs_file_sync_cold_19();
LAB_0015347d:
    fs_file_sync_cold_20();
LAB_00153482:
    fs_file_sync_cold_21();
LAB_00153487:
    fs_file_sync_cold_22();
LAB_0015348c:
    fs_file_sync_cold_23();
LAB_00153491:
    fs_file_sync_cold_24();
LAB_00153496:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00153423;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar2 = 0;
    iov = uVar8;
    iVar1 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 < 0) goto LAB_00153428;
    if (write_req.result < 0) goto LAB_0015342d;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_00153432;
    if (close_req.result != 0) goto LAB_00153437;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_open(0,&open_req1,"test_file",2,0,0);
    if (iVar1 < 0) goto LAB_0015343c;
    if (open_req1.result._4_4_ < 0) goto LAB_00153441;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar8;
    iVar1 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 < 0) goto LAB_00153446;
    if (read_req.result < 0) goto LAB_0015344b;
    iVar2 = 0x2e3070;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00153450;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_ftruncate(0,&ftruncate_req,(int)open_req1.result,7,0);
    if (iVar1 != 0) goto LAB_00153455;
    if (ftruncate_req.result != 0) goto LAB_0015345a;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015345f;
    if (close_req.result != 0) goto LAB_00153464;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_rename(0,&rename_req,"test_file","test_file2",0);
    if (iVar1 != 0) goto LAB_00153469;
    if (rename_req.result != 0) goto LAB_0015346e;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_open(0,&open_req1,"test_file2",0,0,0);
    if (iVar1 < 0) goto LAB_00153473;
    if (open_req1.result._4_4_ < 0) goto LAB_00153478;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar8 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar8;
    iVar1 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 < 0) goto LAB_0015347d;
    if (read_req.result < 0) goto LAB_00153482;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_00153487;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_0015348c;
    if (close_req.result != 0) goto LAB_00153491;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar1 = uv_fs_unlink(0,&unlink_req,"test_file2",0);
    if (iVar1 != 0) goto LAB_00153496;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      iVar1 = unlink("test_file2");
      return iVar1;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(iVar2);
  fs_file_write_null_buffer(iVar2);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_001535f0:
    fs_file_write_null_buffer_cold_2();
LAB_001535f5:
    fs_file_write_null_buffer_cold_3();
LAB_001535fa:
    fs_file_write_null_buffer_cold_4();
LAB_001535ff:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001535f0;
    uv_fs_req_cleanup(&open_req1);
    uVar8 = (uv_buf_t)uv_buf_init(0,0);
    iov = uVar8;
    iVar1 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_001535f5;
    if (write_req.result != 0) goto LAB_001535fa;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_001535ff;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar1 = unlink("test_file");
      return iVar1;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStack_258 = "test_file";
  pcStack_270 = (code *)0x153622;
  unlink("test_dir/file1");
  pcStack_270 = (code *)0x15362e;
  unlink("test_dir/file2");
  pcVar5 = "test_dir";
  pcStack_270 = (code *)0x15363d;
  rmdir("test_dir");
  pcStack_270 = (code *)0x153642;
  __s1 = (uv_fs_t *)uv_default_loop();
  pcStack_270 = (code *)0x153667;
  loop = (uv_loop_t *)__s1;
  iVar1 = uv_fs_mkdir(__s1,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStack_270 = (code *)0x15367d;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00153a85;
    __s1 = (uv_fs_t *)0x0;
    pcStack_270 = (code *)0x1536ad;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file1",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_00153a8a;
    pcStack_270 = (code *)0x1536c1;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_270 = (code *)0x1536d7;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_00153a8f;
    pcStack_270 = (code *)0x1536eb;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_270 = (code *)0x15370e;
    iVar1 = uv_fs_open(0,&open_req1,"test_dir/file2",0x41,0x180,0);
    if (iVar1 < 0) goto LAB_00153a94;
    pcStack_270 = (code *)0x153722;
    uv_fs_req_cleanup();
    __s1 = (uv_fs_t *)0x0;
    pcStack_270 = (code *)0x153738;
    iVar1 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar1 != 0) goto LAB_00153a99;
    pcStack_270 = (code *)0x15374c;
    uv_fs_req_cleanup(&close_req);
    pcStack_270 = (code *)0x15376f;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_00153a9e;
    pcStack_270 = (code *)0x153785;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (scandir_cb_count != 1) goto LAB_00153aa3;
    __s1 = (uv_fs_t *)0x0;
    pcStack_270 = (code *)0x1537ac;
    iVar1 = uv_fs_scandir(0,&scandir_req,"test_dir",0,0);
    if (iVar1 != 2) goto LAB_00153aa8;
    if (scandir_req.result != 2) goto LAB_00153aad;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00153ab2;
    pcStack_270 = (code *)0x1537e0;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_268);
    if (iVar1 != -0xfff) {
      pcVar5 = "file1";
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        __s1 = (uv_fs_t *)puStack_268;
        pcVar6 = "file1";
        pcStack_270 = (code *)0x15380e;
        iVar1 = strcmp((char *)puStack_268,"file1");
        if (iVar1 != 0) {
          pcVar6 = "file2";
          pcStack_270 = (code *)0x15381d;
          iVar1 = strcmp((char *)__s1,"file2");
          if (iVar1 != 0) {
            pcStack_270 = (code *)0x153a80;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &puStack_268;
            goto LAB_00153a80;
          }
        }
        dent.name = (char *)(ulong)uStack_260;
        pcStack_270 = (code *)0x15382e;
        dent._8_8_ = pcVar6;
        assert_is_file_type(dent);
        pcStack_270 = (code *)0x153839;
        iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_268);
        unaff_R15 = &puStack_268;
      } while (iVar1 != -0xfff);
    }
    __s1 = &scandir_req;
    pcStack_270 = (code *)0x15384c;
    uv_fs_req_cleanup();
    if (scandir_req.ptr != (void *)0x0) goto LAB_00153ab7;
    pcStack_270 = (code *)0x15387b;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00153abc;
    pcStack_270 = (code *)0x153891;
    uv_run(loop,0);
    pcStack_270 = (code *)0x1538b2;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00153ac1;
    pcStack_270 = (code *)0x1538c8;
    uv_run(loop,0);
    pcStack_270 = (code *)0x1538e9;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00153ac6;
    pcStack_270 = (code *)0x1538ff;
    uv_run(loop,0);
    pcStack_270 = (code *)0x153920;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00153acb;
    pcStack_270 = (code *)0x153936;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (stat_cb_count != 4) goto LAB_00153ad0;
    pcStack_270 = (code *)0x153964;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00153ad5;
    pcStack_270 = (code *)0x15397a;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 1) goto LAB_00153ada;
    pcStack_270 = (code *)0x1539a8;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_00153adf;
    pcStack_270 = (code *)0x1539be;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (unlink_cb_count != 2) goto LAB_00153ae4;
    pcStack_270 = (code *)0x1539ec;
    __s1 = (uv_fs_t *)loop;
    iVar1 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_00153ae9;
    pcStack_270 = (code *)0x153a02;
    __s1 = (uv_fs_t *)loop;
    uv_run(loop,0);
    if (rmdir_cb_count != 1) goto LAB_00153aee;
    pcStack_270 = (code *)0x153a1b;
    unlink("test_dir/file1");
    pcStack_270 = (code *)0x153a27;
    unlink("test_dir/file2");
    pcStack_270 = (code *)0x153a33;
    rmdir("test_dir");
    pcStack_270 = (code *)0x153a38;
    pcVar5 = (char *)uv_default_loop();
    pcStack_270 = (code *)0x153a4c;
    uv_walk(pcVar5,close_walk_cb,0);
    pcStack_270 = (code *)0x153a56;
    uv_run(pcVar5,0);
    pcStack_270 = (code *)0x153a5b;
    __s1 = (uv_fs_t *)uv_default_loop();
    pcStack_270 = (code *)0x153a63;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_00153a80:
    pcStack_270 = (code *)0x153a85;
    run_test_fs_async_dir_cold_1();
LAB_00153a85:
    pcStack_270 = (code *)0x153a8a;
    run_test_fs_async_dir_cold_2();
LAB_00153a8a:
    pcStack_270 = (code *)0x153a8f;
    run_test_fs_async_dir_cold_3();
LAB_00153a8f:
    pcStack_270 = (code *)0x153a94;
    run_test_fs_async_dir_cold_4();
LAB_00153a94:
    pcStack_270 = (code *)0x153a99;
    run_test_fs_async_dir_cold_5();
LAB_00153a99:
    pcStack_270 = (code *)0x153a9e;
    run_test_fs_async_dir_cold_6();
LAB_00153a9e:
    pcStack_270 = (code *)0x153aa3;
    run_test_fs_async_dir_cold_7();
LAB_00153aa3:
    pcStack_270 = (code *)0x153aa8;
    run_test_fs_async_dir_cold_8();
LAB_00153aa8:
    pcStack_270 = (code *)0x153aad;
    run_test_fs_async_dir_cold_9();
LAB_00153aad:
    pcStack_270 = (code *)0x153ab2;
    run_test_fs_async_dir_cold_10();
LAB_00153ab2:
    pcStack_270 = (code *)0x153ab7;
    run_test_fs_async_dir_cold_25();
LAB_00153ab7:
    pcStack_270 = (code *)0x153abc;
    run_test_fs_async_dir_cold_12();
LAB_00153abc:
    pcStack_270 = (code *)0x153ac1;
    run_test_fs_async_dir_cold_13();
LAB_00153ac1:
    pcStack_270 = (code *)0x153ac6;
    run_test_fs_async_dir_cold_14();
LAB_00153ac6:
    pcStack_270 = (code *)0x153acb;
    run_test_fs_async_dir_cold_15();
LAB_00153acb:
    pcStack_270 = (code *)0x153ad0;
    run_test_fs_async_dir_cold_16();
LAB_00153ad0:
    pcStack_270 = (code *)0x153ad5;
    run_test_fs_async_dir_cold_17();
LAB_00153ad5:
    pcStack_270 = (code *)0x153ada;
    run_test_fs_async_dir_cold_18();
LAB_00153ada:
    pcStack_270 = (code *)0x153adf;
    run_test_fs_async_dir_cold_19();
LAB_00153adf:
    pcStack_270 = (code *)0x153ae4;
    run_test_fs_async_dir_cold_20();
LAB_00153ae4:
    pcStack_270 = (code *)0x153ae9;
    run_test_fs_async_dir_cold_21();
LAB_00153ae9:
    pcStack_270 = (code *)0x153aee;
    run_test_fs_async_dir_cold_22();
LAB_00153aee:
    pcStack_270 = (code *)0x153af3;
    run_test_fs_async_dir_cold_23();
  }
  pcStack_270 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (__s1 == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_00153b52;
    if (mkdir_req.result != 0) goto LAB_00153b57;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00153b5c;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      iVar1 = uv_fs_req_cleanup(&mkdir_req);
      return iVar1;
    }
  }
  else {
    pcStack_278 = (code *)0x153b52;
    mkdir_cb_cold_1();
LAB_00153b52:
    pcStack_278 = (code *)0x153b57;
    mkdir_cb_cold_2();
LAB_00153b57:
    pcStack_278 = (code *)0x153b5c;
    mkdir_cb_cold_3();
LAB_00153b5c:
    pcStack_278 = (code *)0x153b61;
    mkdir_cb_cold_5();
  }
  pcStack_278 = scandir_cb;
  mkdir_cb_cold_4();
  pcStack_298 = pcVar5;
  pcStack_290 = unaff_R12;
  puStack_280 = unaff_R14;
  pcStack_278 = (code *)unaff_R15;
  if (__s1 == &scandir_req) {
    puVar7 = __s1;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00153c6d;
    if (scandir_req.result != 2) goto LAB_00153c72;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00153c77;
    puVar7 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_2a8);
    __s1 = (uv_fs_t *)puStack_2a8;
    while (iVar1 != -0xfff) {
      pcVar5 = "file1";
      puStack_2a8 = (uv_loop_t *)__s1;
      iVar1 = strcmp((char *)__s1,"file1");
      if (iVar1 != 0) {
        pcVar5 = "file2";
        iVar1 = strcmp((char *)__s1,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00153c68;
        }
      }
      dent_00.name = (char *)(ulong)uStack_2a0;
      dent_00._8_8_ = pcVar5;
      assert_is_file_type(dent_00);
      puVar7 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&puStack_2a8);
      __s1 = (uv_fs_t *)puStack_2a8;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00153c7c;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00153c81;
    puVar7 = &scandir_req;
    iVar1 = uv_fs_req_cleanup();
    if (scandir_req.ptr == (void *)0x0) {
      return iVar1;
    }
  }
  else {
LAB_00153c68:
    scandir_cb_cold_1();
    puVar7 = __s1;
LAB_00153c6d:
    scandir_cb_cold_2();
LAB_00153c72:
    scandir_cb_cold_3();
LAB_00153c77:
    scandir_cb_cold_8();
LAB_00153c7c:
    scandir_cb_cold_7();
LAB_00153c81:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar7 < 2) {
    return extraout_EAX;
  }
  assert_is_file_type_cold_1();
  if (puVar7 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00153ce9;
    if (stat_req.result != 0) goto LAB_00153cee;
    if (stat_req.ptr == (void *)0x0) goto LAB_00153cf3;
    stat_cb_count = stat_cb_count + 1;
    puVar7 = &stat_req;
    uv_fs_req_cleanup();
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_00;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00153ce9:
    stat_cb_cold_2();
LAB_00153cee:
    stat_cb_cold_3();
LAB_00153cf3:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar7 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_00153d35;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(&unlink_req);
      return iVar1;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_00153d35:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar7 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00153d99;
    if (rmdir_req.result != 0) goto LAB_00153d9e;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        iVar1 = uv_fs_req_cleanup(&rmdir_req);
        return iVar1;
      }
      goto LAB_00153da8;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00153d99:
    rmdir_cb_cold_2();
LAB_00153d9e:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00153da8:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return 0;
}

Assistant:

TEST_IMPL(fs_file_loop) {
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  unlink("test_symlink");
  r = uv_fs_symlink(NULL, &req, "test_symlink", "test_symlink", 0, NULL);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support symlinks; we'll get UV_ENOTSUP.
   * Starting with vista they are supported, but only when elevated, otherwise
   * we'll see UV_EPERM.
   */
  if (r == UV_ENOTSUP || r == UV_EPERM)
    return 0;
#elif defined(__MSYS__)
  /* MSYS2's approximation of symlinks with copies does not work for broken
     links.  */
  if (r == UV_ENOENT)
    return 0;
#endif
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_symlink", O_RDONLY, 0, NULL);
  ASSERT(r == UV_ELOOP);
  ASSERT(req.result == UV_ELOOP);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(loop, &req, "test_symlink", O_RDONLY, 0, open_loop_cb);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  unlink("test_symlink");

  MAKE_VALGRIND_HAPPY();
  return 0;
}